

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O2

int run_test_pipe_bind_error_inval(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  int64_t eval_b;
  int64_t eval_a;
  uv_pipe_t server;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,&server,0);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_pipe_bind(&server,"/tmp/uv-test-sock");
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      iVar1 = uv_pipe_bind(&server,"/tmp/uv-test-sock2");
      eval_a = (int64_t)iVar1;
      eval_b = -0x16;
      if (eval_a == -0x16) {
        uv_close((uv_handle_t *)&server,close_cb);
        puVar2 = uv_default_loop();
        uv_run(puVar2,UV_RUN_DEFAULT);
        eval_a = 1;
        eval_b = (int64_t)close_cb_called;
        if (eval_b == 1) {
          puVar2 = uv_default_loop();
          close_loop(puVar2);
          eval_a = 0;
          puVar2 = uv_default_loop();
          iVar1 = uv_loop_close(puVar2);
          eval_b = (int64_t)iVar1;
          if (eval_b == 0) {
            uv_library_shutdown();
            return 0;
          }
          pcVar4 = "uv_loop_close(uv_default_loop())";
          pcVar3 = "0";
          uVar5 = 0x73;
        }
        else {
          pcVar4 = "close_cb_called";
          pcVar3 = "1";
          uVar5 = 0x71;
        }
      }
      else {
        pcVar4 = "UV_EINVAL";
        pcVar3 = "r";
        uVar5 = 0x6b;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "r";
      uVar5 = 0x69;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "r";
    uVar5 = 0x67;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
          ,uVar5,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(pipe_bind_error_inval) {
  uv_pipe_t server;
  int r;

  r = uv_pipe_init(uv_default_loop(), &server, 0);
  ASSERT_OK(r);
  r = uv_pipe_bind(&server, TEST_PIPENAME);
  ASSERT_OK(r);
  r = uv_pipe_bind(&server, TEST_PIPENAME_2);
  ASSERT_EQ(r, UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}